

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSDDOMParser.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::XSDDOMParser::docCharacters
          (XSDDOMParser *this,XMLCh *chars,XMLSize_t length,bool cdataSection)

{
  bool bVar1;
  XMLCh toAppend;
  XMLBuffer *this_00;
  XMLCh *chars_00;
  uint uVar2;
  LastExtEntityInfo lastInfo;
  
  if ((this->super_XercesDOMParser).super_AbstractDOMParser.fWithinElement == true) {
    if (this->fInnerAnnotationDepth == -1) {
      bVar1 = XMLReader::isAllSpaces
                        ((((this->super_XercesDOMParser).super_AbstractDOMParser.fScanner)->
                         fReaderMgr).fCurReader,chars,length);
      if (!bVar1) {
        ReaderMgr::getLastExtEntityInfo
                  (&((this->super_XercesDOMParser).super_AbstractDOMParser.fScanner)->fReaderMgr,
                   &lastInfo);
        XSDLocator::setValues
                  (&this->fXSLocator,lastInfo.systemId,lastInfo.publicId,lastInfo.lineNumber,
                   lastInfo.colNumber);
        XSDErrorReporter::emitError
                  (&this->fXSDErrorReporter,0x49,(XMLCh *)XMLUni::fgValidityDomain,
                   &(this->fXSLocator).super_Locator);
      }
    }
    else {
      this_00 = &this->fAnnotationBuf;
      if (cdataSection) {
        XMLBuffer::append(this_00,(XMLCh *)XMLUni::fgCDataStart);
        XMLBuffer::append(this_00,chars,length);
        XMLBuffer::append(this_00,L"]]>");
        return;
      }
      for (uVar2 = 0; uVar2 < length; uVar2 = uVar2 + 1) {
        toAppend = chars[uVar2];
        chars_00 = L"amp";
        if (toAppend == L'&') {
LAB_003243c7:
          XMLBuffer::append(this_00,L'&');
          XMLBuffer::append(this_00,chars_00);
          toAppend = L';';
        }
        else if (toAppend == L'<') {
          chars_00 = L"lt";
          goto LAB_003243c7;
        }
        XMLBuffer::append(this_00,toAppend);
      }
    }
  }
  return;
}

Assistant:

void XSDDOMParser::docCharacters(  const   XMLCh* const    chars
                              , const XMLSize_t       length
                              , const bool            cdataSection)
{
    // Ignore chars outside of content
    if (!fWithinElement)
        return;

    if (fInnerAnnotationDepth == -1)
    {
        if (!((ReaderMgr*) fScanner->getReaderMgr())->getCurrentReader()->isAllSpaces(chars, length))
        {
            ReaderMgr::LastExtEntityInfo lastInfo;
            fScanner->getReaderMgr()->getLastExtEntityInfo(lastInfo);
            fXSLocator.setValues(lastInfo.systemId, lastInfo.publicId, lastInfo.lineNumber, lastInfo.colNumber);
            fXSDErrorReporter.emitError(XMLValid::NonWSContent, XMLUni::fgValidityDomain, &fXSLocator);
        }
    }
    // when it's within either of the 2 annotation subelements, characters are
    // allowed and we need to store them.
    else if (cdataSection == true)
    {
        fAnnotationBuf.append(XMLUni::fgCDataStart);
        fAnnotationBuf.append(chars, length);
        fAnnotationBuf.append(XMLUni::fgCDataEnd);
    }
    else
    {
        for(unsigned int i = 0; i < length; i++ )
        {
            if(chars[i] == chAmpersand)
            {
                fAnnotationBuf.append(chAmpersand);
                fAnnotationBuf.append(XMLUni::fgAmp);
                fAnnotationBuf.append(chSemiColon);
            }
            else if (chars[i] == chOpenAngle)
            {
                fAnnotationBuf.append(chAmpersand);
                fAnnotationBuf.append(XMLUni::fgLT);
                fAnnotationBuf.append(chSemiColon);
            }
            else {
                fAnnotationBuf.append(chars[i]);
            }
        }
    }
}